

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haptic2.cpp
# Opt level: O3

void get_all_haptics(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  ALLEGRO_HAPTIC *pAVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  
  num_haptics = 0;
  uVar3 = al_get_current_display();
  cVar1 = al_is_display_haptic(uVar3);
  iVar7 = num_haptics;
  if (cVar1 != '\0') {
    pAVar4 = (ALLEGRO_HAPTIC *)al_get_haptic_from_display(uVar3);
    iVar7 = num_haptics;
    lVar6 = (long)num_haptics;
    haptics[lVar6].haptic = pAVar4;
    if (pAVar4 != (ALLEGRO_HAPTIC *)0x0) {
      haptics[lVar6].name = "display";
      haptics[lVar6].playing = false;
      num_haptics = iVar7 + 1;
      iVar7 = num_haptics;
    }
  }
  if (iVar7 < 8) {
    iVar7 = 0;
    do {
      iVar2 = al_get_num_joysticks();
      if (iVar2 <= iVar7) {
        return;
      }
      uVar3 = al_get_joystick(iVar7);
      cVar1 = al_is_joystick_haptic(uVar3);
      iVar2 = num_haptics;
      if (cVar1 != '\0') {
        pAVar4 = (ALLEGRO_HAPTIC *)al_get_haptic_from_joystick(uVar3);
        iVar2 = num_haptics;
        haptics[num_haptics].haptic = pAVar4;
        if (pAVar4 != (ALLEGRO_HAPTIC *)0x0) {
          pcVar5 = (char *)al_get_joystick_name(uVar3);
          haptics[num_haptics].name = pcVar5;
          haptics[num_haptics].playing = false;
          num_haptics = num_haptics + 1;
          iVar2 = num_haptics;
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar2 < 8);
  }
  return;
}

Assistant:

static void get_all_haptics() {
   num_haptics = 0;
   ALLEGRO_DISPLAY * display = al_get_current_display();

   if (al_is_display_haptic(display)) {
      haptics[num_haptics].haptic = al_get_haptic_from_display(display);
      if (haptics[num_haptics].haptic) {
         haptics[num_haptics].name = (const char *)"display";
         haptics[num_haptics].playing = false;
         num_haptics++;
      }
   }

   for (int i = 0;
      num_haptics < EX_MAX_HAPTICS && i < al_get_num_joysticks();
      i++)
   {
      ALLEGRO_JOYSTICK *joy = al_get_joystick(i);
      if (al_is_joystick_haptic(joy)) {
         haptics[num_haptics].haptic = al_get_haptic_from_joystick(joy);
         if (haptics[num_haptics].haptic) {
            const char *name = al_get_joystick_name(joy);
            haptics[num_haptics].name = (const char *)name;
            haptics[num_haptics].playing = false;
            num_haptics++;
         }
      }
   }

}